

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O0

void Fxu_HeapSingleMoveUp(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  Fxu_Single **pSingle2;
  Fxu_Single **ppPar;
  Fxu_Single **ppSingle;
  Fxu_Single *pSingle_local;
  Fxu_HeapSingle *p_local;
  
  ppPar = p->pTree + pSingle->HNum;
  while ((1 < (*ppPar)->HNum &&
         (pSingle2 = p->pTree + ((*ppPar)->HNum >> 1), (*pSingle2)->Weight < (*ppPar)->Weight))) {
    Fxu_HeapSingleSwap(ppPar,pSingle2);
    ppPar = pSingle2;
  }
  return;
}

Assistant:

void Fxu_HeapSingleMoveUp( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    Fxu_Single ** ppSingle, ** ppPar;
    ppSingle = &FXU_HEAP_SINGLE_CURRENT(p, pSingle);
    while ( FXU_HEAP_SINGLE_PARENT_EXISTS(p,*ppSingle) )
    {
        ppPar = &FXU_HEAP_SINGLE_PARENT(p,*ppSingle);
        if ( FXU_HEAP_SINGLE_WEIGHT(*ppSingle) > FXU_HEAP_SINGLE_WEIGHT(*ppPar) )
        {
            Fxu_HeapSingleSwap( ppSingle, ppPar );
            ppSingle = ppPar;
        }
        else
            break;
    }
}